

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MCU.cpp
# Opt level: O1

void __thiscall
kpeg::MCU::constructMCU
          (MCU *this,array<std::vector<int,_std::allocator<int>_>,_3UL> *compRLE,
          vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
          *QTables)

{
  long lVar1;
  undefined1 auVar2 [16];
  pointer piVar3;
  pointer piVar4;
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  Level LVar8;
  Logger *pLVar9;
  ostream *poVar10;
  pair<const_int,_const_int> pVar11;
  long lVar12;
  Level lvl;
  int iVar13;
  Level lvl_00;
  int compID;
  long lVar14;
  ulong uVar15;
  int i_1;
  long lVar16;
  array<int,_64UL> zzOrder;
  string local_130 [8];
  
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::operator=((vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
               *)&m_QTables,QTables);
  m_MCUCount = m_MCUCount + 1;
  pLVar9 = Logger::get();
  LVar8 = Logger::getLevel(pLVar9);
  if (1 < (int)LVar8) {
    pLVar9 = Logger::get();
    poVar10 = Logger::getStream(pLVar9);
    Logger::levelStr_abi_cxx11_(local_130,(Logger *)0x2,lvl);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,(char *)CONCAT44(local_130[0]._M_dataplus._M_p._4_4_,
                                                  (int)local_130[0]._M_dataplus._M_p),
                         local_130[0]._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"[ kpeg:",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"MCU.cpp",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,":",1);
    *(uint *)(&poVar10->field_0x18 + (long)poVar10->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar10->field_0x18 + (long)poVar10->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x46);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ] ",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"Constructing MCU: ",0x12);
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,m_MCUCount);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"...",3);
    std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_130[0]._M_dataplus._M_p._4_4_,(int)local_130[0]._M_dataplus._M_p) !=
        &local_130[0].field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_130[0]._M_dataplus._M_p._4_4_,
                               (int)local_130[0]._M_dataplus._M_p),
                      local_130[0].field_2._M_allocated_capacity + 1);
    }
  }
  lVar14 = 0;
  do {
    memset(local_130,0,0x100);
    piVar3 = compRLE->_M_elems[lVar14].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = compRLE->_M_elems[lVar14].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    iVar13 = -1;
    uVar15 = 0;
    do {
      if ((piVar3[uVar15] == 0) && (piVar3[uVar15 + 1] == 0)) break;
      iVar13 = iVar13 + piVar3[uVar15] + 1;
      *(int *)((long)&local_130[0]._M_dataplus._M_p + (long)iVar13 * 4) = piVar3[uVar15 + 1];
      uVar15 = uVar15 + 2;
    } while (uVar15 <= ((long)piVar4 - (long)piVar3 >> 2) - 2U);
    iVar13 = (&DCDiff)[lVar14];
    (&DCDiff)[lVar14] = iVar13 + (int)local_130[0]._M_dataplus._M_p;
    local_130[0]._M_dataplus._M_p._0_4_ = iVar13 + (int)local_130[0]._M_dataplus._M_p;
    lVar16 = *(long *)(m_QTables + (ulong)(lVar14 != 0) * 0x18);
    lVar12 = 0;
    do {
      uVar15 = *(ulong *)(lVar16 + lVar12 * 2);
      auVar5._8_4_ = 0;
      auVar5._0_8_ = uVar15;
      auVar5._12_2_ = (short)(uVar15 >> 0x30);
      auVar6._8_2_ = (short)(uVar15 >> 0x20);
      auVar6._0_8_ = uVar15;
      auVar6._10_4_ = auVar5._10_4_;
      auVar7._6_8_ = 0;
      auVar7._0_6_ = auVar6._8_6_;
      auVar2 = *(undefined1 (*) [16])((long)&local_130[0]._M_dataplus._M_p + lVar12 * 4);
      lVar1 = lVar12 * 4;
      *(ulong *)((long)&local_130[0]._M_dataplus._M_p + lVar1) =
           CONCAT44(auVar2._4_4_ * (int)CONCAT82(SUB148(auVar7 << 0x40,6),(short)(uVar15 >> 0x10)),
                    (int)((ulong)auVar2._0_4_ * (uVar15 & 0xffff)));
      *(int *)((long)&local_130[0].field_2 + lVar1) =
           (int)((auVar2._8_8_ & 0xffffffff) * ((ulong)auVar6._8_6_ & 0xffffffff));
      *(uint *)((long)&local_130[0].field_2 + lVar1 + 4) = auVar2._12_4_ * (auVar5._10_4_ >> 0x10);
      lVar12 = lVar12 + 4;
    } while (lVar12 != 0x40);
    lVar16 = 0;
    do {
      pVar11 = zzOrderToMatIndices((int)lVar16);
      (this->m_8x8block)._M_elems[lVar14]._M_elems[pVar11.first]._M_elems[(long)pVar11 >> 0x20] =
           *(int *)((long)&local_130[0]._M_dataplus._M_p + lVar16 * 4);
      lVar16 = lVar16 + 1;
    } while (lVar16 != 0x40);
    lVar14 = lVar14 + 1;
    if (lVar14 == 3) {
      computeIDCT(this);
      performLevelShift(this);
      convertYCbCrToRGB(this);
      pLVar9 = Logger::get();
      LVar8 = Logger::getLevel(pLVar9);
      if (1 < (int)LVar8) {
        pLVar9 = Logger::get();
        poVar10 = Logger::getStream(pLVar9);
        Logger::levelStr_abi_cxx11_(local_130,(Logger *)0x2,lvl_00);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar10,(char *)CONCAT44(local_130[0]._M_dataplus._M_p._4_4_,
                                                      (int)local_130[0]._M_dataplus._M_p),
                             local_130[0]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"[ kpeg:",7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"MCU.cpp",7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,":",1);
        *(uint *)(&poVar10->field_0x18 + (long)poVar10->_vptr_basic_ostream[-3]) =
             *(uint *)(&poVar10->field_0x18 + (long)poVar10->_vptr_basic_ostream[-3]) & 0xffffffb5 |
             2;
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x95);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," ] ",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,"Finished constructing MCU: ",0x1b);
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,m_MCUCount);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"...",3);
        std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_130[0]._M_dataplus._M_p._4_4_,(int)local_130[0]._M_dataplus._M_p) !=
            &local_130[0].field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_130[0]._M_dataplus._M_p._4_4_,
                                   (int)local_130[0]._M_dataplus._M_p),
                          local_130[0].field_2._M_allocated_capacity + 1);
        }
      }
      return;
    }
  } while( true );
}

Assistant:

void MCU::constructMCU( const std::array<std::vector<int>, 3>& compRLE, const std::vector<std::vector<UInt16>>& QTables )
    {
        m_QTables = QTables;
        
        m_MCUCount++;
        
        LOG(Logger::Level::DEBUG) << "Constructing MCU: " << m_MCUCount << "..." << std::endl;
        
//         for ( auto&& rle : compRLE )
//         {
//             std::string rleStr = "";
//             for ( auto v = 0; v < rle.size(); v += 2 )
//             {
//                 std::stringstream ss;
//                 ss << "(" << rle[v] << ", " << rle[v + 1] << ") ";
//                 rleStr += ss.str();
//             }
//             
//             LOG(Logger::Level::DEBUG) << "RLE decoded data: " << rleStr << std::endl;
//         }
        
        const char* component[] = { "Y (Luminance)", "Cb (Chrominance)", "Cr (Chrominance)" };
        const char* type[] = { "DC", "AC" };    
        
        for ( int compID = 0; compID < 3; compID++ )
        {
            //LOG(Logger::Level::DEBUG) << "Constructing matrix for: MCU-" << m_MCUCount << ": " << component[compID] << "..." << std::endl;
            
            // Initialize with all zeros
            std::array<int, 64> zzOrder;            
            std::fill( zzOrder.begin(), zzOrder.end(), 0 );
            int j = -1;
            
            for ( auto i = 0; i <= compRLE[compID].size() - 2; i += 2 )
            {
                if ( compRLE[compID][i] == 0 && compRLE[compID][i + 1] == 0 )
                    break;
                
                j += compRLE[compID][i] + 1; // Skip the number of positions containing zeros
                zzOrder[j] = compRLE[compID][i + 1];
            }
            
            // DC_i = DC_i-1 + DC-difference
            DCDiff[compID] += zzOrder[0];
            zzOrder[0] = DCDiff[compID];
            
            int QIndex = compID == 0 ? 0 : 1;
            for ( auto i = 0; i < 64; ++i ) // !!!!!! i = 1
                zzOrder[i] *= m_QTables[QIndex][i];
            
            // Zig-zag order to 2D matrix order
            for ( auto i = 0; i < 64; ++i )
            {
                auto coords = zzOrderToMatIndices( i );
                
                m_8x8block[compID][ coords.first ][ coords.second ] = zzOrder[i];
            }
            
//             for ( auto&& row : m_8x8block[compID] )
//             {
//                 for ( auto&& val : row )
//                     std::cout << val << "\t";
//                 std::cout << std::endl;
//             }
//             std::cout << std::endl;

//             std::string matrix = "";
//             for ( auto&& row : m_8x8block[compID] )
//             {
//                 for ( auto&& val : row )
//                 {
//                     std::stringstream ss;
//                     ss << std::setw(7) << std::setfill(' ') << val << "";
//                     matrix += ss.str();
//                 }
//                 matrix += "\n";
//             }
//             
//             LOG(Logger::Level::DEBUG) << "DCT Matrix: " << component[compID] << ":-\n" << matrix << std::endl;
        }
        
        computeIDCT();
        performLevelShift();
        convertYCbCrToRGB();
        
        LOG(Logger::Level::DEBUG) << "Finished constructing MCU: " << m_MCUCount << "..." << std::endl;
    }